

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.h
# Opt level: O0

void __thiscall crnlib::ktx_texture::clear(ktx_texture *this)

{
  ktx_texture *this_local;
  
  ktx_header::clear(&this->m_header);
  vector<crnlib::vector<unsigned_char>_>::clear(&this->m_key_values);
  vector<crnlib::vector<unsigned_char>_>::clear(&this->m_image_data);
  this->m_block_dim = 0;
  this->m_bytes_per_block = 0;
  this->m_opposite_endianness = false;
  return;
}

Assistant:

void clear()
        {
            m_header.clear();
            m_key_values.clear();
            m_image_data.clear();

            m_block_dim = 0;
            m_bytes_per_block = 0;

            m_opposite_endianness = false;
        }